

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O1

size_t __thiscall
Memory::RecyclerSweep::
GetHeapBlockCount<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket)

{
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  uint uVar2;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *pSVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  
  if ((heapBucket->super_HeapBucket).heapInfo == this->heapInfo) {
    uVar2 = HeapBucket::GetBucketIndex(&heapBucket->super_HeapBucket);
    pSVar3 = (this->normalData).bucketData[uVar2].pendingSweepList;
    lVar6 = 0;
    while (pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      pSVar1 = (pSVar3->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
      if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        pSVar3 = (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      }
      else {
        pSVar3 = HeapBlock::AsNormalBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
      }
      lVar6 = lVar6 + 1;
    }
    pSVar3 = (this->normalData).bucketData[uVar2].pendingEmptyBlockList;
    lVar4 = 0;
    while (pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      pSVar1 = (pSVar3->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
      if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        pSVar3 = (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      }
      else {
        pSVar3 = HeapBlock::AsNormalBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
      }
      lVar4 = lVar4 + 1;
    }
    sVar5 = lVar4 + lVar6;
  }
  else {
    sVar5 = 0;
  }
  return sVar5;
}

Assistant:

size_t
RecyclerSweep::GetHeapBlockCount(HeapBucketT<TBlockType> const * heapBucket)
{
    if (heapBucket->heapInfo != this->heapInfo)
    {
        return 0;
    }
    auto& bucketData = this->GetBucketData(heapBucket);
    return HeapBlockList::Count(bucketData.pendingSweepList)
        + HeapBlockList::Count(bucketData.pendingEmptyBlockList);
}